

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_publish2process(fio_msg_internal_s *m)

{
  size_t *psVar1;
  uintptr_t *puVar2;
  uint uVar3;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [24];
  fio_lock_i fVar7;
  int iVar8;
  channel_s *pcVar9;
  uint64_t hashed;
  size_t sVar10;
  fio_ch_set__ordered_s_ *pfVar11;
  fio_lock_i ret;
  uint local_c4;
  code *local_c0;
  channel_s *pcStack_b8;
  fio_msg_internal_s *local_b0;
  undefined8 local_a8;
  size_t sStack_a0;
  char *local_98;
  code *local_90;
  channel_s *pcStack_88;
  fio_msg_internal_s *local_80;
  channel_s local_78;
  undefined8 uStack_38;
  undefined1 local_30;
  
  local_78.name_len = (m->channel).len;
  if (local_78.name_len == 0) {
    (m->channel).data = (char *)0x0;
  }
  if ((m->data).len == 0) {
    (m->data).data = (char *)0x0;
  }
  uVar3 = m->filter;
  if ((ulong)uVar3 == 0) {
    local_78.name = (m->channel).data;
    local_78.match = (fio_match_fn)0x0;
    local_78.lock = '\0';
    local_78._57_7_ = 0;
    local_78.subscriptions.next = (fio_ls_embd_s *)0x0;
    local_78.parent = (fio_collection_s *)0x0;
    local_78.ref = 0;
    local_78.subscriptions.prev = (fio_ls_embd_s *)0x0;
    hashed = fio_siphash_xy(local_78.name,local_78.name_len,1,3,0x18bb68,0x18bb68);
    pcVar9 = fio_channel_find_dup_internal(&local_78,hashed,&fio_postoffice.pubsub);
  }
  else {
    local_78.name = (char *)&local_c4;
    local_78.match = (fio_match_fn)0x0;
    local_78.lock = '\0';
    local_78._57_7_ = 0;
    local_78.subscriptions.next = (fio_ls_embd_s *)0x0;
    local_78.parent = (fio_collection_s *)0x0;
    local_78.ref = 0;
    local_78.subscriptions.prev = (fio_ls_embd_s *)0x0;
    local_78.name_len = 4;
    local_c4 = uVar3;
    pcVar9 = fio_channel_find_dup_internal(&local_78,(ulong)uVar3,&fio_postoffice.filters);
    if (pcVar9 == (channel_s *)0x0) goto LAB_00130f4f;
  }
  if (pcVar9 != (channel_s *)0x0) {
    local_90 = fio_publish2channel_task;
    LOCK();
    m->ref = m->ref + 1;
    UNLOCK();
    task.arg1 = pcVar9;
    task.func = fio_publish2channel_task;
    task.arg2 = m;
    pcStack_88 = pcVar9;
    local_80 = m;
    fio_defer_push_task_fn(task,&task_queue_urgent);
  }
  if (m->filter == 0) {
    LOCK();
    UNLOCK();
    local_78.name_len = CONCAT71(local_78.name_len._1_7_,fio_postoffice.patterns.lock);
    if (fio_postoffice.patterns.lock != '\0') {
      do {
        fio_postoffice.patterns.lock = '\x01';
        local_78.name_len = 0;
        local_78.name = &DAT_00000001;
        nanosleep((timespec *)&local_78,(timespec *)0x0);
        LOCK();
        UNLOCK();
        local_78.name_len = CONCAT71(local_78.name_len._1_7_,fio_postoffice.patterns.lock);
      } while (fio_postoffice.patterns.lock != '\0');
    }
    fio_postoffice.patterns.lock = '\x01';
    if ((fio_postoffice.patterns.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
       (pfVar11 = fio_postoffice.patterns.channels.ordered,
       fio_postoffice.patterns.channels.ordered <
       fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos)) {
      do {
        if (pfVar11->hash != 0) {
          pcVar9 = pfVar11->obj;
          local_a8 = 0;
          sStack_a0 = pcVar9->name_len;
          local_98 = pcVar9->name;
          uVar4 = pcVar9->name_len;
          uVar5 = pcVar9->name;
          auVar6._8_8_ = uVar5;
          auVar6._0_8_ = uVar4;
          auVar6._16_8_ = 0;
          iVar8 = (*pcVar9->match)((fio_str_info_s)(auVar6 << 0x40),m->channel);
          if (iVar8 != 0) {
            if (pfVar11->obj != (channel_s *)0x0) {
              LOCK();
              psVar1 = &pfVar11->obj->ref;
              *psVar1 = *psVar1 + 1;
              UNLOCK();
            }
            local_c0 = fio_publish2channel_task;
            pcStack_b8 = pfVar11->obj;
            LOCK();
            m->ref = m->ref + 1;
            UNLOCK();
            task_00.arg1 = pcStack_b8;
            task_00.func = fio_publish2channel_task;
            task_00.arg2 = m;
            local_b0 = m;
            fio_defer_push_task_fn(task_00,&task_queue_urgent);
          }
        }
        pfVar11 = pfVar11 + 1;
      } while (pfVar11 < fio_postoffice.patterns.channels.ordered +
                         fio_postoffice.patterns.channels.pos);
    }
    fVar7 = fio_postoffice.patterns.lock;
    LOCK();
    fio_postoffice.patterns.lock = '\0';
    UNLOCK();
    local_78.name_len = CONCAT71(local_78.name_len._1_7_,fVar7);
  }
LAB_00130f4f:
  LOCK();
  puVar2 = &m->ref;
  *puVar2 = *puVar2 - 1;
  UNLOCK();
  if (*puVar2 == 0) {
    sVar10 = m->meta_len;
    if (sVar10 != 0) {
      do {
        m->meta_len = sVar10 - 1;
        if (*(long *)(&m->filter + sVar10 * 6) != 0) {
          local_78.name_len = local_78.name_len & 0xffffffff00000000;
          local_78.subscriptions.prev = (fio_ls_embd_s *)(m->channel).data;
          local_78.name = (char *)(m->channel).capa;
          local_78.ref = (m->channel).len;
          local_78.match = (fio_match_fn)(m->data).data;
          local_78.subscriptions.next = (fio_ls_embd_s *)(m->data).capa;
          local_78.parent = (fio_collection_s *)(m->data).len;
          local_78.lock = '\0';
          local_78._57_7_ = 0;
          uStack_38 = 0;
          local_30 = 0;
          (**(code **)(&m->filter + sVar10 * 6))(&local_78,(&m->meta_len)[sVar10 * 3]);
        }
        sVar10 = m->meta_len;
      } while (sVar10 != 0);
    }
    fio_free(m);
  }
  return;
}

Assistant:

static void fio_publish2process(fio_msg_internal_s *m) {
  fio_msg_internal_finalize(m);
  channel_s *ch;
  if (m->filter) {
    ch = fio_filter_find_dup(m->filter);
    if (!ch) {
      goto finish;
    }
  } else {
    ch = fio_channel_find_dup(m->channel);
  }
  /* exact match */
  if (ch) {
    fio_defer_push_urgent(fio_publish2channel_task, ch,
                          fio_msg_internal_dup(m));
  }
  if (m->filter == 0) {
    /* pattern matching match */
    fio_lock(&fio_postoffice.patterns.lock);
    FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, p) {
      if (!p->hash) {
        continue;
      }

      if (p->obj->match(
              (fio_str_info_s){.data = p->obj->name, .len = p->obj->name_len},
              m->channel)) {
        fio_channel_dup(p->obj);
        fio_defer_push_urgent(fio_publish2channel_task, p->obj,
                              fio_msg_internal_dup(m));
      }
    }
    fio_unlock(&fio_postoffice.patterns.lock);
  }
finish:
  fio_msg_internal_free(m);
}